

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O3

int __thiscall
QSocks5SocketEngine::accept
          (QSocks5SocketEngine *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  long lVar1;
  Type *this_00;
  qintptr socketDescriptor;
  storage_type *psVar2;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_socks5BindStore>_> *this_01;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QString local_58;
  QArrayData *local_38;
  char16_t *pcStack_30;
  qsizetype local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  if (*(int *)(lVar1 + 0xd8) == 10) {
    psVar2 = &DAT_00000014;
  }
  else {
    if (*(int *)(lVar1 + 0xd8) == 9) {
      QObject::disconnect((QObject *)**(undefined8 **)(lVar1 + 0xf8),(char *)0x0,(QObject *)0x0,
                          (char *)0x0);
      QObject::setParent((QObject *)**(undefined8 **)(lVar1 + 0xf8));
      this_01 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_socks5BindStore>_>
                 *)(*(long *)(lVar1 + 0x110) + 0x10);
      QHostAddress::operator=((QHostAddress *)this_01,(QHostAddress *)(lVar1 + 0xa8));
      *(undefined2 *)(*(long *)(lVar1 + 0x110) + 0x18) = *(undefined2 *)(lVar1 + 0xb0);
      socketDescriptor = *(qintptr *)(lVar1 + 0xf0);
      this_00 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_socks5BindStore>_>
                ::operator()(this_01);
      QSocks5BindStore::add(this_00,socketDescriptor,*(QSocks5BindData **)(lVar1 + 0x110));
      *(undefined8 *)(lVar1 + 0x110) = 0;
      *(undefined4 *)(lVar1 + 0xd8) = 0;
      *(undefined4 *)(lVar1 + 0x98) = 0;
      *(undefined8 *)(lVar1 + 0xf0) = 0;
      *(undefined8 *)(lVar1 + 0xf8) = 0;
      goto LAB_0023af8a;
    }
    psVar2 = (storage_type *)0x12;
  }
  QVar3.m_data = psVar2;
  QVar3.m_size = (qsizetype)&local_38;
  QString::fromLatin1(QVar3);
  local_58.d.d = (Data *)local_38;
  local_58.d.ptr = pcStack_30;
  local_58.d.size = local_28;
  QAbstractSocketEngine::setError((QAbstractSocketEngine *)this,ProxyProtocolError,&local_58);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  socketDescriptor = -1;
LAB_0023af8a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (int)socketDescriptor;
  }
  __stack_chk_fail();
}

Assistant:

qintptr QSocks5SocketEngine::accept()
{
    Q_D(QSocks5SocketEngine);
    // check we are listing ---

    QSOCKS5_Q_DEBUG << "accept()";

    qintptr sd = -1;
    switch (d->socks5State) {
    case QSocks5SocketEnginePrivate::BindSuccess:
        QSOCKS5_Q_DEBUG << "BindSuccess adding" << d->socketDescriptor << "to the bind store";
        d->data->controlSocket->disconnect();
        d->data->controlSocket->setParent(nullptr);
        d->bindData->localAddress = d->localAddress;
        d->bindData->localPort = d->localPort;
        sd = d->socketDescriptor;
        socks5BindStore()->add(sd, d->bindData);
        d->data = nullptr;
        d->bindData = nullptr;
        d->socketDescriptor = 0;
        //### do something about this socket layer ... set it closed and an error about why ...
        // reset state and local port/address
        d->socks5State = QSocks5SocketEnginePrivate::Uninitialized; // ..??
        d->socketState = QAbstractSocket::UnconnectedState;
        break;
    case QSocks5SocketEnginePrivate::ControlSocketError:
        setError(QAbstractSocket::ProxyProtocolError, "Control socket error"_L1);
        break;
    default:
        setError(QAbstractSocket::ProxyProtocolError, "SOCKS5 proxy error"_L1);
        break;
    }
    return sd;
}